

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.cpp
# Opt level: O0

void __thiscall
correctness_small_fuzzing_0_128_Test::~correctness_small_fuzzing_0_128_Test
          (correctness_small_fuzzing_0_128_Test *this)

{
  void *in_RDI;
  
  ~correctness_small_fuzzing_0_128_Test((correctness_small_fuzzing_0_128_Test *)0x14e4b8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(correctness, small_fuzzing_0_128) {
    srand(0);
    for (int i = 0; i < 100; ++i) {
        std::string input;
        for (int j = 0; j < 100; ++j) {
            input += static_cast<char>(rand() % 128);
        }
        check_eq(input);
    }
}